

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O2

void it_filter(DUMB_CLICK_REMOVER *cr,IT_FILTER_STATE *state,sample_t_conflict *dst,int32 pos,
              sample_t_conflict *src,int32 size,int step,int sampfreq,int cutoff,int resonance)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  float fVar9;
  float fVar10;
  
  iVar7 = state->currsample;
  iVar8 = state->prevsample;
  dVar1 = exp2((double)cutoff * -0.00016276041666666666 + -0.25);
  fVar9 = (float)((double)sampfreq * 0.0014468631190172304 * dVar1);
  dVar1 = exp((double)resonance * -0.021586735246781247);
  fVar10 = (1.0 - (float)dVar1) / fVar9;
  if (2.0 <= fVar10) {
    fVar10 = 2.0;
  }
  fVar10 = 1.0 / (fVar9 * fVar9 + 1.0 + ((float)dVar1 - fVar10) * fVar9);
  fVar9 = -(fVar9 * fVar9) * fVar10;
  iVar4 = (int)(fVar10 * 2.6843546e+08);
  iVar3 = (int)(2.6843546e+08 - (fVar9 + fVar10) * 2.6843546e+08);
  iVar2 = (int)(fVar9 * 2.6843546e+08);
  if (cr != (DUMB_CLICK_REMOVER *)0x0) {
    dumb_record_click(cr,pos,(int)((ulong)((long)(iVar8 << 4) * (long)iVar2) >> 0x20) +
                             (int)((ulong)((long)(*src << 4) * (long)iVar4) >> 0x20) +
                             (int)((ulong)((long)(iVar7 << 4) * (long)iVar3) >> 0x20));
  }
  for (lVar6 = 0; iVar5 = iVar7, lVar6 < step * size; lVar6 = lVar6 + step) {
    iVar7 = (int)((ulong)((long)(iVar8 << 4) * (long)iVar2) >> 0x20) +
            (int)((ulong)((long)(iVar5 << 4) * (long)iVar3) >> 0x20) +
            (int)((ulong)((long)(src[lVar6] << 4) * (long)iVar4) >> 0x20);
    dst[step * pos + lVar6] = dst[step * pos + lVar6] + iVar7;
    iVar8 = iVar5;
  }
  if (cr != (DUMB_CLICK_REMOVER *)0x0) {
    dumb_record_click(cr,size + pos,
                      -((int)((ulong)((long)iVar2 * (long)(iVar8 << 4)) >> 0x20) +
                        (int)((ulong)((long)iVar3 * (long)(iVar5 << 4)) >> 0x20) +
                       (int)((ulong)((long)iVar4 * (long)(src[step * size] << 4)) >> 0x20)));
  }
  state->currsample = iVar5;
  state->prevsample = iVar8;
  return;
}

Assistant:

static void it_filter(DUMB_CLICK_REMOVER *cr, IT_FILTER_STATE *state, sample_t *dst, int32 pos, sample_t *src, int32 size, int step, int sampfreq, int cutoff, int resonance)
{
#if defined(_USE_SSE) && (defined(_M_IX86) || defined(__i386__) || defined(_M_X64) || defined(__amd64__))
    _dumb_init_sse();
	if ( _dumb_it_use_sse ) it_filter_sse( cr, state, dst, pos, src, size, step, sampfreq, cutoff, resonance );
	else
#endif
	it_filter_int( cr, state, dst, pos, src, size, step, sampfreq, cutoff, resonance );
}